

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall c4::yml::Tree::child(Tree *this,size_t node,size_t pos)

{
  code *pcVar1;
  Location LVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  char msg [29];
  char local_38 [40];
  
  if (node == 0xffffffffffffffff) {
    builtin_strncpy(local_38 + 0x10,"ode != NONE)",0xd);
    builtin_strncpy(local_38,"check failed: (n",0x10);
    if ((((byte)s_error_flags & 1) != 0) && (bVar5 = is_debugger_attached(), bVar5)) {
      pcVar1 = (code *)swi(3);
      sVar3 = (*pcVar1)();
      return sVar3;
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x677b) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x677b) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_38,0x1d,LVar2,(this->m_callbacks).m_user_data);
    node = 0xffffffffffffffff;
  }
  sVar3 = first_child(this,node);
  if (pos != 0 && sVar3 != 0xffffffffffffffff) {
    lVar4 = pos - 1;
    do {
      sVar3 = next_sibling(this,sVar3);
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
      if (sVar3 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
    } while (bVar5);
  }
  return sVar3;
}

Assistant:

size_t Tree::child(size_t node, size_t pos) const
{
    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    size_t count = 0;
    for(size_t i = first_child(node); i != NONE; i = next_sibling(i))
    {
        if(count++ == pos)
            return i;
    }
    return NONE;
}